

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O3

void rxa2_initial_hash(uint8_t *blockhash,argon2_context *context,argon2_type type)

{
  uint8_t value [4];
  blake2b_state BlakeHash;
  size_t in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  uint32_t uVar1;
  blake2b_state local_118;
  
  if (blockhash != (uint8_t *)0x0 && context != (argon2_context *)0x0) {
    blake2b_init(&local_118,0x40);
    blake2b_update(&local_118,&stack0xfffffffffffffee4,4);
    blake2b_update(&local_118,&stack0xfffffffffffffee4,4);
    blake2b_update(&local_118,&stack0xfffffffffffffee4,4);
    blake2b_update(&local_118,&stack0xfffffffffffffee4,4);
    blake2b_update(&local_118,&stack0xfffffffffffffee4,4);
    blake2b_update(&local_118,&stack0xfffffffffffffee4,4);
    uVar1 = context->pwdlen;
    blake2b_update(&local_118,&stack0xfffffffffffffee4,4);
    if (context->pwd != (uint8_t *)0x0) {
      blake2b_update(&local_118,context->pwd,(ulong)context->pwdlen);
      if ((context->flags & 1) != 0) {
        rxa2_secure_wipe_memory
                  ((void *)CONCAT44(uVar1,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8);
        context->pwdlen = 0;
      }
    }
    blake2b_update(&local_118,&stack0xfffffffffffffee4,4);
    if (context->salt != (uint8_t *)0x0) {
      blake2b_update(&local_118,context->salt,(ulong)context->saltlen);
    }
    uVar1 = context->secretlen;
    blake2b_update(&local_118,&stack0xfffffffffffffee4,4);
    if (context->secret != (uint8_t *)0x0) {
      blake2b_update(&local_118,context->secret,(ulong)context->secretlen);
      if ((context->flags & 2) != 0) {
        rxa2_secure_wipe_memory
                  ((void *)CONCAT44(uVar1,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8);
        context->secretlen = 0;
      }
    }
    blake2b_update(&local_118,&stack0xfffffffffffffee4,4);
    if (context->ad != (uint8_t *)0x0) {
      blake2b_update(&local_118,context->ad,(ulong)context->adlen);
    }
    blake2b_final(&local_118,blockhash,0x40);
  }
  return;
}

Assistant:

void rxa2_initial_hash(uint8_t *blockhash, argon2_context *context, argon2_type type) {
	blake2b_state BlakeHash;
	uint8_t value[sizeof(uint32_t)];

	if (NULL == context || NULL == blockhash) {
		return;
	}

	blake2b_init(&BlakeHash, ARGON2_PREHASH_DIGEST_LENGTH);

	store32(&value, context->lanes);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->outlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->m_cost);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->t_cost);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->version);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, (uint32_t)type);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->pwdlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->pwd != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->pwd,
			context->pwdlen);

		if (context->flags & ARGON2_FLAG_CLEAR_PASSWORD) {
			rxa2_secure_wipe_memory(context->pwd, context->pwdlen);
			context->pwdlen = 0;
		}
	}

	store32(&value, context->saltlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->salt != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->salt, context->saltlen);
	}

	store32(&value, context->secretlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->secret != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->secret,
			context->secretlen);

		if (context->flags & ARGON2_FLAG_CLEAR_SECRET) {
			rxa2_secure_wipe_memory(context->secret, context->secretlen);
			context->secretlen = 0;
		}
	}

	store32(&value, context->adlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->ad != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->ad,
			context->adlen);
	}

	blake2b_final(&BlakeHash, blockhash, ARGON2_PREHASH_DIGEST_LENGTH);
}